

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

void __thiscall Rml::Element::OnAttributeChange(Element *this,ElementAttributes *changed_attributes)

{
  ElementMeta *pEVar1;
  EventDispatcher *this_00;
  Variant *pVVar2;
  bool bVar3;
  Display DVar4;
  EventId EVar5;
  ulong uVar6;
  char *pcVar7;
  Type TVar8;
  pointer ppVar9;
  PropertyMap *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  pair<__gnu_cxx::__normal_iterator<std::pair<Rml::EventId,_Rml::EventListener_*>_*,_std::vector<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>_>,_bool>
  pVar13;
  const_iterator cVar14;
  String local_438;
  String local_418;
  Property local_3f8;
  Property local_3a8;
  Property local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_308;
  String *dir_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  Property local_2c0;
  String local_270;
  reference local_250;
  pair<Rml::PropertyId,_Rml::Property> *name_value;
  const_iterator __end8;
  const_iterator __begin8;
  PropertyMap *__range8;
  StyleSheetParser parser;
  PropertyDictionary properties;
  EventListener *listener;
  EventListener *local_180;
  __normal_iterator<std::pair<Rml::EventId,_Rml::EventListener_*>_*,_std::vector<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>_>
  local_178;
  pair<__gnu_cxx::__normal_iterator<std::pair<Rml::EventId,_Rml::EventListener_*>_*,_std::vector<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>_>,_bool>
  insertion_result;
  undefined1 local_148 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value_as_string;
  anon_class_24_3_a0796ab4 remove_event_listener_if_exists;
  EventId local_ea;
  EventDispatcher *pEStack_e8;
  EventId event_id;
  EventDispatcher *event_dispatcher;
  SmallUnorderedMap<EventId,_EventListener_*> *attribute_event_listeners;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  Variant *local_48;
  Variant *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *attribute;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  *element_attribute;
  const_iterator __end1;
  const_iterator __begin1;
  ElementAttributes *__range1;
  ElementAttributes *changed_attributes_local;
  Element *this_local;
  
  __end1 = itlib::
           flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
           ::begin(changed_attributes);
  element_attribute =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
        *)itlib::
          flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
          ::end(changed_attributes);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
                                     *)&element_attribute), bVar3) {
    value = (Variant *)
            __gnu_cxx::
            __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
            ::operator*(&__end1);
    local_48 = &((reference)value)->second;
    attribute = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)value;
    bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              value,"id");
    pVVar2 = local_48;
    if (bVar3) {
      ::std::__cxx11::string::string((string *)&local_88);
      Variant::Get<std::__cxx11::string>(&local_68,pVVar2,&local_88);
      ::std::__cxx11::string::operator=((string *)&this->id,(string *)&local_68);
      ::std::__cxx11::string::~string((string *)&local_68);
      ::std::__cxx11::string::~string((string *)&local_88);
    }
    else {
      bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )value,"class");
      pVVar2 = local_48;
      if (bVar3) {
        pEVar1 = this->meta;
        ::std::__cxx11::string::string((string *)&attribute_event_listeners);
        Variant::Get<std::__cxx11::string>
                  (&local_b8,pVVar2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &attribute_event_listeners);
        ElementStyle::SetClassNames(&pEVar1->style,&local_b8);
        ::std::__cxx11::string::~string((string *)&local_b8);
        ::std::__cxx11::string::~string((string *)&attribute_event_listeners);
      }
      else {
        bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)value,"colspan");
        if ((((bVar3) ||
             (bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)value,"rowspan"), bVar3)) &&
            (DVar4 = Style::ComputedValues::display(&this->meta->computed_values),
            DVar4 == TableCell)) ||
           ((bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)value,"span"), bVar3 &&
            ((DVar4 = Style::ComputedValues::display(&this->meta->computed_values),
             DVar4 == TableColumn ||
             (DVar4 = Style::ComputedValues::display(&this->meta->computed_values),
             DVar4 == TableColumnGroup)))))) {
          (*(this->super_ScriptInterface).super_Releasable._vptr_Releasable[0x15])();
        }
        else {
          uVar6 = ::std::__cxx11::string::size();
          if (((uVar6 < 3) ||
              (pcVar7 = (char *)::std::__cxx11::string::operator[]((ulong)value), *pcVar7 != 'o'))
             || (pcVar7 = (char *)::std::__cxx11::string::operator[]((ulong)value), *pcVar7 != 'n'))
          {
            bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)value,"style");
            if (bVar3) {
              TVar8 = Variant::GetType(local_48);
              if (TVar8 == STRING) {
                PropertyDictionary::PropertyDictionary((PropertyDictionary *)&parser.line_number);
                StyleSheetParser::StyleSheetParser((StyleSheetParser *)&__range8);
                pbVar10 = Variant::GetReference<std::__cxx11::string>(local_48);
                StyleSheetParser::ParseProperties
                          ((StyleSheetParser *)&__range8,(PropertyDictionary *)&parser.line_number,
                           pbVar10);
                this_01 = PropertyDictionary::GetProperties
                                    ((PropertyDictionary *)&parser.line_number);
                cVar14 = robin_hood::detail::
                         Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                         ::begin(this_01);
                __end8.mInfo = (uint8_t *)cVar14.mKeyVals;
                cVar14 = robin_hood::detail::
                         Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                         ::end(this_01);
                while( true ) {
                  __end8.mKeyVals = (NodePtr)cVar14.mInfo;
                  name_value = &(cVar14.mKeyVals)->mData;
                  bVar3 = robin_hood::detail::
                          Table<true,80ul,Rml::PropertyId,Rml::Property,robin_hood::hash<Rml::PropertyId,void>,std::equal_to<Rml::PropertyId>>
                          ::Iter<true>::operator!=
                                    ((Iter<true> *)&__end8.mInfo,(Iter<true> *)&name_value);
                  if (!bVar3) break;
                  local_250 = robin_hood::detail::
                              Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                              ::Iter<true>::operator*((Iter<true> *)&__end8.mInfo);
                  ElementStyle::SetProperty(&this->meta->style,local_250->first,&local_250->second);
                  robin_hood::detail::
                  Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                  ::Iter<true>::operator++((Iter<true> *)&__end8.mInfo);
                  cVar14.mInfo = (uint8_t *)__end8.mKeyVals;
                  cVar14.mKeyVals = (NodePtr)name_value;
                }
                StyleSheetParser::~StyleSheetParser((StyleSheetParser *)&__range8);
                PropertyDictionary::~PropertyDictionary((PropertyDictionary *)&parser.line_number);
              }
              else {
                TVar8 = Variant::GetType(local_48);
                if (TVar8 != NONE) {
                  GetAddress_abi_cxx11_(&local_270,this,false,true);
                  uVar11 = ::std::__cxx11::string::c_str();
                  Log::Message(LT_WARNING,
                               "Invalid \'style\' attribute, string type required. In element: %s",
                               uVar11);
                  ::std::__cxx11::string::~string((string *)&local_270);
                }
              }
            }
            else {
              bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)value,"lang");
              if (bVar3) {
                TVar8 = Variant::GetType(local_48);
                if (TVar8 == STRING) {
                  pEVar1 = this->meta;
                  pbVar10 = Variant::GetReference<std::__cxx11::string>(local_48);
                  ::std::__cxx11::string::string((string *)&local_2e0,(string *)pbVar10);
                  Property::Property<std::__cxx11::string>(&local_2c0,&local_2e0,STRING,-1);
                  ElementStyle::SetProperty(&pEVar1->style,RmlUi_Language,&local_2c0);
                  Property::~Property(&local_2c0);
                  ::std::__cxx11::string::~string((string *)&local_2e0);
                }
                else {
                  TVar8 = Variant::GetType(local_48);
                  if (TVar8 != NONE) {
                    GetAddress_abi_cxx11_((String *)&dir_value,this,false,true);
                    uVar11 = ::std::__cxx11::string::c_str();
                    Log::Message(LT_WARNING,
                                 "Invalid \'lang\' attribute, string type required. In element: %s",
                                 uVar11);
                    ::std::__cxx11::string::~string((string *)&dir_value);
                  }
                }
              }
              else {
                bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)value,"dir");
                if (bVar3) {
                  TVar8 = Variant::GetType(local_48);
                  if (TVar8 == STRING) {
                    local_308 = Variant::GetReference<std::__cxx11::string>(local_48);
                    bVar3 = ::std::operator==(local_308,"auto");
                    if (bVar3) {
                      pEVar1 = this->meta;
                      Property::Property<Rml::Style::Direction,Rml::Style::Direction>
                                (&local_358,Auto);
                      ElementStyle::SetProperty(&pEVar1->style,RmlUi_Direction,&local_358);
                      Property::~Property(&local_358);
                    }
                    else {
                      bVar3 = ::std::operator==(local_308,"ltr");
                      if (bVar3) {
                        pEVar1 = this->meta;
                        Property::Property<Rml::Style::Direction,Rml::Style::Direction>
                                  (&local_3a8,Ltr);
                        ElementStyle::SetProperty(&pEVar1->style,RmlUi_Direction,&local_3a8);
                        Property::~Property(&local_3a8);
                      }
                      else {
                        bVar3 = ::std::operator==(local_308,"rtl");
                        if (bVar3) {
                          pEVar1 = this->meta;
                          Property::Property<Rml::Style::Direction,Rml::Style::Direction>
                                    (&local_3f8,Rtl);
                          ElementStyle::SetProperty(&pEVar1->style,RmlUi_Direction,&local_3f8);
                          Property::~Property(&local_3f8);
                        }
                        else {
                          uVar11 = ::std::__cxx11::string::c_str();
                          GetAddress_abi_cxx11_(&local_418,this,false,true);
                          uVar12 = ::std::__cxx11::string::c_str();
                          Log::Message(LT_WARNING,
                                       "Invalid \'dir\' attribute \'%s\', value must be \'auto\', \'ltr\', or \'rtl\'. In element: %s"
                                       ,uVar11,uVar12);
                          ::std::__cxx11::string::~string((string *)&local_418);
                        }
                      }
                    }
                  }
                  else {
                    TVar8 = Variant::GetType(local_48);
                    if (TVar8 != NONE) {
                      GetAddress_abi_cxx11_(&local_438,this,false,true);
                      uVar11 = ::std::__cxx11::string::c_str();
                      Log::Message(LT_WARNING,
                                   "Invalid \'dir\' attribute, string type required. In element: %s"
                                   ,uVar11);
                      ::std::__cxx11::string::~string((string *)&local_438);
                    }
                  }
                }
              }
            }
          }
          else {
            event_dispatcher = (EventDispatcher *)this->meta;
            pEStack_e8 = &this->meta->event_dispatcher;
            ::std::__cxx11::string::substr
                      ((ulong)&remove_event_listener_if_exists.event_id,(ulong)value);
            EVar5 = EventSpecificationInterface::GetIdOrInsert
                              ((String *)&remove_event_listener_if_exists.event_id);
            ::std::__cxx11::string::~string((string *)&remove_event_listener_if_exists.event_id);
            value_as_string.field_2._8_8_ = event_dispatcher;
            remove_event_listener_if_exists.attribute_event_listeners =
                 (SmallUnorderedMap<EventId,_EventListener_*> *)pEStack_e8;
            remove_event_listener_if_exists.event_dispatcher._0_2_ = EVar5;
            local_ea = EVar5;
            TVar8 = Variant::GetType(local_48);
            if (TVar8 == STRING) {
              OnAttributeChange::anon_class_24_3_a0796ab4::operator()
                        ((anon_class_24_3_a0796ab4 *)((long)&value_as_string.field_2 + 8));
              pVVar2 = local_48;
              ::std::__cxx11::string::string((string *)&insertion_result.second);
              Variant::Get<std::__cxx11::string>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_148,pVVar2,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &insertion_result.second);
              ::std::__cxx11::string::~string((string *)&insertion_result.second);
              this_00 = event_dispatcher;
              local_180 = Factory::InstanceEventListener((String *)local_148,this);
              pVar13 = itlib::
                       flat_map<Rml::EventId,Rml::EventListener*,itlib::fmimpl::less,std::vector<std::pair<Rml::EventId,Rml::EventListener*>,std::allocator<std::pair<Rml::EventId,Rml::EventListener*>>>>
                       ::emplace<Rml::EventId_const&,Rml::EventListener*>
                                 ((flat_map<Rml::EventId,Rml::EventListener*,itlib::fmimpl::less,std::vector<std::pair<Rml::EventId,Rml::EventListener*>,std::allocator<std::pair<Rml::EventId,Rml::EventListener*>>>>
                                   *)this_00,&local_ea,&local_180);
              local_178 = pVar13.first._M_current;
              insertion_result.first._M_current._0_1_ = pVar13.second;
              ppVar9 = __gnu_cxx::
                       __normal_iterator<std::pair<Rml::EventId,_Rml::EventListener_*>_*,_std::vector<std::pair<Rml::EventId,_Rml::EventListener_*>,_std::allocator<std::pair<Rml::EventId,_Rml::EventListener_*>_>_>_>
                       ::operator->(&local_178);
              if (ppVar9->second != (EventListener *)0x0) {
                EventDispatcher::AttachEvent(pEStack_e8,local_ea,ppVar9->second,false);
              }
              ::std::__cxx11::string::~string((string *)local_148);
            }
            else {
              TVar8 = Variant::GetType(local_48);
              if (TVar8 == NONE) {
                OnAttributeChange::anon_class_24_3_a0796ab4::operator()
                          ((anon_class_24_3_a0796ab4 *)((long)&value_as_string.field_2 + 8));
              }
            }
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
    ::operator++(&__end1);
  }
  DirtyDefinition(this,SelfAndSiblings);
  return;
}

Assistant:

void Element::OnAttributeChange(const ElementAttributes& changed_attributes)
{
	for (const auto& element_attribute : changed_attributes)
	{
		const auto& attribute = element_attribute.first;
		const auto& value = element_attribute.second;
		if (attribute == "id")
		{
			id = value.Get<String>();
		}
		else if (attribute == "class")
		{
			meta->style.SetClassNames(value.Get<String>());
		}
		else if (((attribute == "colspan" || attribute == "rowspan") && meta->computed_values.display() == Style::Display::TableCell) ||
			(attribute == "span" &&
				(meta->computed_values.display() == Style::Display::TableColumn ||
					meta->computed_values.display() == Style::Display::TableColumnGroup)))
		{
			DirtyLayout();
		}
		else if (attribute.size() > 2 && attribute[0] == 'o' && attribute[1] == 'n')
		{
			static constexpr bool IN_CAPTURE_PHASE = false;

			auto& attribute_event_listeners = meta->attribute_event_listeners;
			auto& event_dispatcher = meta->event_dispatcher;
			const auto event_id = EventSpecificationInterface::GetIdOrInsert(attribute.substr(2));
			const auto remove_event_listener_if_exists = [&attribute_event_listeners, &event_dispatcher, event_id]() {
				const auto listener_it = attribute_event_listeners.find(event_id);
				if (listener_it != attribute_event_listeners.cend())
				{
					event_dispatcher.DetachEvent(event_id, listener_it->second, IN_CAPTURE_PHASE);
					attribute_event_listeners.erase(listener_it);
				}
			};

			if (value.GetType() == Variant::Type::STRING)
			{
				remove_event_listener_if_exists();

				const auto value_as_string = value.Get<String>();
				auto insertion_result = attribute_event_listeners.emplace(event_id, Factory::InstanceEventListener(value_as_string, this));
				if (auto* listener = insertion_result.first->second)
					event_dispatcher.AttachEvent(event_id, listener, IN_CAPTURE_PHASE);
			}
			else if (value.GetType() == Variant::Type::NONE)
				remove_event_listener_if_exists();
		}
		else if (attribute == "style")
		{
			if (value.GetType() == Variant::STRING)
			{
				PropertyDictionary properties;
				StyleSheetParser parser;
				parser.ParseProperties(properties, value.GetReference<String>());

				for (const auto& name_value : properties.GetProperties())
					meta->style.SetProperty(name_value.first, name_value.second);
			}
			else if (value.GetType() != Variant::NONE)
				Log::Message(Log::LT_WARNING, "Invalid 'style' attribute, string type required. In element: %s", GetAddress().c_str());
		}
		else if (attribute == "lang")
		{
			if (value.GetType() == Variant::STRING)
				meta->style.SetProperty(PropertyId::RmlUi_Language, Property(value.GetReference<String>(), Unit::STRING));
			else if (value.GetType() != Variant::NONE)
				Log::Message(Log::LT_WARNING, "Invalid 'lang' attribute, string type required. In element: %s", GetAddress().c_str());
		}
		else if (attribute == "dir")
		{
			if (value.GetType() == Variant::STRING)
			{
				const String& dir_value = value.GetReference<String>();

				if (dir_value == "auto")
					meta->style.SetProperty(PropertyId::RmlUi_Direction, Property(Style::Direction::Auto));
				else if (dir_value == "ltr")
					meta->style.SetProperty(PropertyId::RmlUi_Direction, Property(Style::Direction::Ltr));
				else if (dir_value == "rtl")
					meta->style.SetProperty(PropertyId::RmlUi_Direction, Property(Style::Direction::Rtl));
				else
					Log::Message(Log::LT_WARNING, "Invalid 'dir' attribute '%s', value must be 'auto', 'ltr', or 'rtl'. In element: %s",
						dir_value.c_str(), GetAddress().c_str());
			}
			else if (value.GetType() != Variant::NONE)
				Log::Message(Log::LT_WARNING, "Invalid 'dir' attribute, string type required. In element: %s", GetAddress().c_str());
		}
	}

	// Any change to the attributes may affect which styles apply to the current element, in particular due to attribute selectors, ID selectors, and
	// class selectors. This can further affect all siblings or descendants due to sibling or descendant combinators.
	DirtyDefinition(DirtyNodes::SelfAndSiblings);
}